

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::nonfinite_writer<wchar_t>::operator()
          (nonfinite_writer<wchar_t> *this,wchar_t **it)

{
  char cVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  
  pwVar2 = *it;
  pwVar3 = pwVar2;
  if ((ulong)this->sign != 0) {
    cVar1 = *(char *)((long)&basic_data<void>::signs + (ulong)this->sign);
    pwVar3 = pwVar2 + 1;
    *it = pwVar3;
    *pwVar2 = (int)cVar1;
  }
  pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,wchar_t*>(this->str,this->str + 3,pwVar3);
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It&& it) const {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    it = copy_str<Char>(str, str + str_size, it);
  }